

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-ipv6.c
# Opt level: O1

int is_from_client(sockaddr *addr)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_udp_t *loop;
  uv_loop_t *loop_00;
  char *pcVar3;
  char dst [256];
  sockaddr_in sStack_290;
  sockaddr_in sStack_280;
  uv_buf_t uStack_270;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined1 local_108;
  
  if (addr == (sockaddr *)0x0) {
    return 1;
  }
  if (addr->sa_family == 10) {
    uStack_120 = 0x177599;
    iVar1 = uv_inet_ntop(10,addr->sa_data + 6,(char *)&stack0xfffffffffffffee8,0x100);
    if (iVar1 != 0) {
      return 0;
    }
    uStack_120 = 0x1775b9;
    printf("from [%.*s]:%d\n",0x100,&stack0xfffffffffffffee8,(ulong)*(ushort *)addr->sa_data);
    if (*(uint16_t *)addr->sa_data == client_port) {
      if ((local_108 == '\0' && local_118 == 0x313a666666663a3a) && local_110 == 0x312e302e302e3732)
      {
        return 1;
      }
      return 0;
    }
    return 0;
  }
  uStack_120 = 0x17760a;
  is_from_client_cold_1();
  pcVar3 = "239.255.0.1";
  iVar1 = 0x23a3;
  uStack_120 = addr;
  iVar2 = uv_ip4_addr("239.255.0.1",0x23a3,&sStack_280);
  if (iVar2 == 0) {
    loop = (uv_udp_t *)uv_default_loop();
    iVar1 = 0x5505c0;
    iVar2 = uv_udp_init((uv_loop_t *)loop,&server);
    if (iVar2 != 0) goto LAB_0017776e;
    pcVar3 = "0.0.0.0";
    iVar1 = 0;
    iVar2 = uv_ip4_addr("0.0.0.0",0,&sStack_290);
    loop = (uv_udp_t *)pcVar3;
    if (iVar2 != 0) goto LAB_00177773;
    loop = &server;
    iVar1 = (int)&sStack_290;
    iVar2 = uv_udp_bind(&server,(sockaddr *)&sStack_290,0);
    if (iVar2 != 0) goto LAB_00177778;
    loop = &server;
    iVar1 = 0x18e334;
    iVar2 = uv_udp_set_multicast_interface(&server,"0.0.0.0");
    if (iVar2 != 0) goto LAB_0017777d;
    uStack_270 = uv_buf_init("PING",4);
    iVar1 = 0x5505c0;
    loop = (uv_udp_t *)&stack0xfffffffffffffda0;
    iVar2 = uv_udp_send((uv_udp_send_t *)loop,&server,&uStack_270,1,(sockaddr *)&sStack_280,
                        sv_send_cb);
    if (iVar2 != 0) goto LAB_00177782;
    if (close_cb_called != 0) goto LAB_00177787;
    if (sv_send_cb_called != 0) goto LAB_0017778c;
    loop = (uv_udp_t *)uv_default_loop();
    iVar1 = 0;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (sv_send_cb_called != 1) goto LAB_00177791;
    if (close_cb_called != 1) goto LAB_00177796;
    if (server.send_queue_size != 0) goto LAB_0017779b;
    loop_00 = uv_default_loop();
    uv_walk(loop_00,close_walk_cb,(void *)0x0);
    iVar1 = 0;
    uv_run(loop_00,UV_RUN_DEFAULT);
    loop = (uv_udp_t *)uv_default_loop();
    iVar2 = uv_loop_close((uv_loop_t *)loop);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_udp_multicast_interface_cold_1();
    loop = (uv_udp_t *)pcVar3;
LAB_0017776e:
    run_test_udp_multicast_interface_cold_2();
LAB_00177773:
    run_test_udp_multicast_interface_cold_3();
LAB_00177778:
    run_test_udp_multicast_interface_cold_4();
LAB_0017777d:
    run_test_udp_multicast_interface_cold_5();
LAB_00177782:
    run_test_udp_multicast_interface_cold_6();
LAB_00177787:
    run_test_udp_multicast_interface_cold_7();
LAB_0017778c:
    run_test_udp_multicast_interface_cold_8();
LAB_00177791:
    run_test_udp_multicast_interface_cold_9();
LAB_00177796:
    run_test_udp_multicast_interface_cold_10();
LAB_0017779b:
    run_test_udp_multicast_interface_cold_11();
  }
  run_test_udp_multicast_interface_cold_12();
  if ((uv_loop_t *)loop == (uv_loop_t *)0x0) {
    sv_send_cb_cold_3();
  }
  else {
    if ((1 < iVar1 + 1U) && (iVar1 != -0x65)) goto LAB_001777f7;
    loop = *(uv_udp_t **)&((uv_loop_t *)loop)->backend_fd;
    if (loop == &client || loop == &server) {
      sv_send_cb_called = sv_send_cb_called + 1;
      uv_close((uv_handle_t *)loop,close_cb);
      return extraout_EAX;
    }
  }
  sv_send_cb_cold_1();
LAB_001777f7:
  sv_send_cb_cold_2();
  if (loop == &client || loop == &server) {
    close_cb_called = close_cb_called + 1;
    return (int)CONCAT71(0x5505,loop == &server);
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)loop);
  if (iVar1 == 0) {
    uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
    return extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

static int is_from_client(const struct sockaddr* addr) {
  const struct sockaddr_in6* addr6;
  char dst[256];
  int r;

  /* Debugging output, and filter out unwanted network traffic */
  if (addr != NULL) {
    ASSERT(addr->sa_family == AF_INET6);
    addr6 = (struct sockaddr_in6*) addr;
    r = uv_inet_ntop(addr->sa_family, &addr6->sin6_addr, dst, sizeof(dst));
    if (r == 0)
      printf("from [%.*s]:%d\n", (int) sizeof(dst), dst, addr6->sin6_port);
    if (addr6->sin6_port != client_port)
      return 0;
    if (r != 0 || strcmp(dst, "::ffff:127.0.0.1"))
      return 0;
  }
  return 1;
}